

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.cpp
# Opt level: O2

pipe * __thiscall blc::tools::pipe::operator=(pipe *this,pipe *other)

{
  mutex *pmVar1;
  __shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  this->_out = other->_out;
  pmVar1 = other->_inMut;
  this->_in = other->_in;
  this->_inMut = pmVar1;
  this->_outMut = other->_outMut;
  this->_master = other->_master;
  this->_block = other->_block;
  std::__shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_20,&(other->_closed).super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->_closed).super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>,&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  return this;
}

Assistant:

blc::tools::pipe &blc::tools::pipe::operator=(const pipe &other) {
	this->_in = const_cast<blc::tools::pipe &>(other).getIn();
	this->_out = const_cast<blc::tools::pipe &>(other).getOut();
	this->_inMut = const_cast<blc::tools::pipe &>(other).getInMut();
	this->_outMut = const_cast<blc::tools::pipe &>(other).getOutMut();
	this->_master = const_cast<blc::tools::pipe &>(other).getState();
	this->_block = const_cast<blc::tools::pipe &>(other).getBlock();
	this->_closed = const_cast<blc::tools::pipe &>(other).getClosed();
	return (*this);
}